

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPreprocess(Mio_Library_t *pLib,Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,
                      Vec_Wec_t *vGateCnfs,Vec_Ptr_t *vGateHands)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  void **ppvVar6;
  Mio_Gate_t *pGate;
  word wVar7;
  int iVar8;
  long lVar9;
  
  iVar2 = Mio_LibraryReadGateNum(pLib);
  lVar9 = (long)iVar2;
  if (vGateSizes->nCap < iVar2) {
    if (vGateSizes->pArray == (int *)0x0) {
      piVar3 = (int *)malloc(lVar9 * 4);
    }
    else {
      piVar3 = (int *)realloc(vGateSizes->pArray,lVar9 * 4);
    }
    vGateSizes->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vGateSizes->nCap = iVar2;
  }
  if (vGateFuncs->nCap < iVar2) {
    if (vGateFuncs->pArray == (word *)0x0) {
      pwVar4 = (word *)malloc(lVar9 * 8);
    }
    else {
      pwVar4 = (word *)realloc(vGateFuncs->pArray,lVar9 * 8);
    }
    vGateFuncs->pArray = pwVar4;
    if (pwVar4 == (word *)0x0) {
LAB_004be6bf:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    vGateFuncs->nCap = iVar2;
  }
  iVar8 = vGateCnfs->nCap;
  if (iVar8 < iVar2) {
    if (vGateCnfs->pArray == (Vec_Int_t *)0x0) {
      pVVar5 = (Vec_Int_t *)malloc(lVar9 << 4);
    }
    else {
      pVVar5 = (Vec_Int_t *)realloc(vGateCnfs->pArray,lVar9 << 4);
      iVar8 = vGateCnfs->nCap;
    }
    vGateCnfs->pArray = pVVar5;
    memset(pVVar5 + iVar8,0,(long)(iVar2 - iVar8) << 4);
    vGateCnfs->nCap = iVar2;
  }
  vGateCnfs->nSize = iVar2;
  if (vGateHands->nCap < iVar2) {
    if (vGateHands->pArray == (void **)0x0) {
      ppvVar6 = (void **)malloc(lVar9 << 3);
    }
    else {
      ppvVar6 = (void **)realloc(vGateHands->pArray,lVar9 << 3);
    }
    vGateHands->pArray = ppvVar6;
    vGateHands->nCap = iVar2;
  }
  pGate = Mio_LibraryReadGates(pLib);
  do {
    if (pGate == (Mio_Gate_t *)0x0) {
      Sfm_DecCreateCnf(vGateSizes,vGateFuncs,vGateCnfs);
      return;
    }
    iVar2 = Mio_GateReadPinNum(pGate);
    Vec_IntPush(vGateSizes,iVar2);
    wVar7 = Mio_GateReadTruth(pGate);
    uVar1 = vGateFuncs->nSize;
    if (uVar1 == vGateFuncs->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vGateFuncs->pArray == (word *)0x0) {
          pwVar4 = (word *)malloc(0x80);
        }
        else {
          pwVar4 = (word *)realloc(vGateFuncs->pArray,0x80);
        }
        vGateFuncs->pArray = pwVar4;
        if (pwVar4 == (word *)0x0) goto LAB_004be6bf;
        vGateFuncs->nCap = 0x10;
      }
      else {
        if (vGateFuncs->pArray == (word *)0x0) {
          pwVar4 = (word *)malloc((ulong)uVar1 << 4);
        }
        else {
          pwVar4 = (word *)realloc(vGateFuncs->pArray,(ulong)uVar1 << 4);
        }
        vGateFuncs->pArray = pwVar4;
        if (pwVar4 == (word *)0x0) goto LAB_004be6bf;
        vGateFuncs->nCap = uVar1 * 2;
      }
    }
    else {
      pwVar4 = vGateFuncs->pArray;
    }
    iVar2 = vGateFuncs->nSize;
    vGateFuncs->nSize = iVar2 + 1;
    pwVar4[iVar2] = wVar7;
    Mio_GateSetValue(pGate,vGateHands->nSize);
    uVar1 = vGateHands->nSize;
    if (uVar1 == vGateHands->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vGateHands->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vGateHands->pArray,0x80);
        }
        vGateHands->pArray = ppvVar6;
        vGateHands->nCap = 0x10;
      }
      else {
        if (vGateHands->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vGateHands->pArray,(ulong)uVar1 << 4);
        }
        vGateHands->pArray = ppvVar6;
        vGateHands->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = vGateHands->pArray;
    }
    iVar2 = vGateHands->nSize;
    vGateHands->nSize = iVar2 + 1;
    ppvVar6[iVar2] = pGate;
    pGate = Mio_GateReadNext(pGate);
  } while( true );
}

Assistant:

void Sfm_LibPreprocess( Mio_Library_t * pLib, Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs, Vec_Ptr_t * vGateHands )
{
    Mio_Gate_t * pGate;
    int nGates = Mio_LibraryReadGateNum(pLib);
    Vec_IntGrow( vGateSizes, nGates );
    Vec_WrdGrow( vGateFuncs, nGates );
    Vec_WecInit( vGateCnfs,  nGates );
    Vec_PtrGrow( vGateHands, nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        Vec_IntPush( vGateSizes, Mio_GateReadPinNum(pGate) );
        Vec_WrdPush( vGateFuncs, Mio_GateReadTruth(pGate) );
        Mio_GateSetValue( pGate, Vec_PtrSize(vGateHands) );
        Vec_PtrPush( vGateHands, pGate );
    }
    Sfm_DecCreateCnf( vGateSizes, vGateFuncs, vGateCnfs );
}